

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall
immutable::vector<int,_false,_6>::operator==
          (vector<int,_false,_6> *this,vector<int,_false,_6> *other)

{
  int iVar1;
  bool bVar2;
  size_type_conflict sVar3;
  size_type_conflict sVar4;
  reference piVar5;
  ref<immutable::rrb<int,_false,_6>_> rVar6;
  iterator it;
  iterator it2;
  iterator it_end;
  vector_iterator<int,_false,_6> local_88;
  vector_iterator<int,_false,_6> local_68;
  vector_iterator<int,_false,_6> local_48;
  
  sVar3 = size(this);
  sVar4 = size(other);
  if (sVar3 == sVar4) {
    sVar3 = size(this);
    if (sVar3 == 0) {
      bVar2 = true;
    }
    else {
      rVar6.ptr = (this->_impl).ptr;
      if (rVar6.ptr != (rrb<int,_false,_6> *)0x0) {
        (rVar6.ptr)->_ref_count = (rVar6.ptr)->_ref_count + 1;
      }
      local_88._index = 0;
      local_88._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
           (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
      local_88._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
      _M_head_impl = 0xffffffff;
      local_88._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Head_base<0UL,_const_int_*,_false>._M_head_impl = (int *)0x0;
      local_68._impl.ptr = (other->_impl).ptr;
      if (local_68._impl.ptr != (rrb<int,_false,_6> *)0x0) {
        (local_68._impl.ptr)->_ref_count = (local_68._impl.ptr)->_ref_count + 1;
      }
      local_68._index = 0;
      local_68._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
           (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
      local_68._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
      _M_head_impl = 0xffffffff;
      local_68._cursor.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Head_base<0UL,_const_int_*,_false>._M_head_impl = (int *)0x0;
      local_88._impl.ptr = rVar6.ptr;
      vector_iterator<int,_false,_6>::vector_iterator(&local_48,this);
      sVar3 = 0;
      while (bVar2 = rVar6.ptr == local_48._impl.ptr && sVar3 == local_48._index,
            rVar6.ptr != local_48._impl.ptr || sVar3 != local_48._index) {
        piVar5 = vector_iterator<int,_false,_6>::operator*(&local_88);
        iVar1 = *piVar5;
        piVar5 = vector_iterator<int,_false,_6>::operator*(&local_68);
        if (iVar1 != *piVar5) break;
        local_68._index = local_68._index + 1;
        sVar3 = local_88._index + 1;
        rVar6.ptr = local_88._impl.ptr;
        local_88._index = sVar3;
      }
      ref<immutable::rrb<int,_false,_6>_>::~ref(&local_48._impl);
      ref<immutable::rrb<int,_false,_6>_>::~ref(&local_68._impl);
      ref<immutable::rrb<int,_false,_6>_>::~ref(&local_88._impl);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator == (const vector& other) const
        {
        if (size() != other.size())
          return false;
        if (size() == 0)
          return true;
        auto it = begin();
        auto it2 = other.begin();
        auto it_end = end();
        for (; it != it_end; ++it, ++it2)
          {
          if (*it != *it2)
            return false;
          }
        return true;
        }